

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

string * __thiscall
absl::lts_20250127::ReportError_abi_cxx11_
          (string *__return_storage_ptr__,lts_20250127 *this,Nonnull<CordRep_*> root,
          Nonnull<CordRep_*> node)

{
  byte bVar1;
  bool bVar2;
  string *psVar3;
  ostream *poVar4;
  long lVar5;
  char *pcVar6;
  int iVar7;
  ostream *in_R9;
  string_view src;
  string_view src_00;
  string_view label;
  ostringstream buf;
  allocator_type local_221;
  undefined1 local_220 [16];
  Data local_210;
  string *local_1d0;
  Data local_1c8;
  code *local_1c0;
  Data local_1b8;
  undefined8 local_1b0;
  long local_1a8 [2];
  long alStack_198 [12];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Error at node ",0xe);
  poVar4 = std::ostream::_M_insert<void_const*>(local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4," in:",4);
  iVar7 = 0;
  local_1d0 = __return_storage_ptr__;
  do {
    *(undefined8 *)((long)alStack_198 + *(long *)(local_1a8[0] + -0x18)) = 3;
    if ((CordRepBtree *)this == (CordRepBtree *)0x0) {
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      *(undefined8 *)((long)alStack_198 + *(long *)(local_1a8[0] + -0x18)) = 7;
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," [",2);
      std::ostream::_M_insert<void_const*>((ostream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      *(long *)((long)alStack_198 + *(long *)(local_1a8[0] + -0x18)) = (long)iVar7;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"",0);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"NULL\n",5);
      bVar2 = true;
      this = (lts_20250127 *)0x0;
    }
    else {
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      *(undefined8 *)((long)alStack_198 + *(long *)(local_1a8[0] + -0x18)) = 7;
      std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," [",2);
      std::ostream::_M_insert<void_const*>((ostream *)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]",1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      pcVar6 = (char *)(long)iVar7;
      *(char **)((long)alStack_198 + *(long *)(local_1a8[0] + -0x18)) = pcVar6;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"",0);
      bVar1 = (((CordRepBtree *)this)->super_CordRep).tag;
      if (bVar1 == 1) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"SUBSTRING @ ",0xc);
        if ((((CordRepBtree *)this)->super_CordRep).tag != '\x01') {
LAB_004ac72d:
          __assert_fail("IsSubstring()",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                        ,0x37b,"CordRepSubstring *absl::cord_internal::CordRep::substring()");
        }
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        lVar5 = 0x18;
        if ((((CordRepBtree *)this)->super_CordRep).tag != '\x01') goto LAB_004ac72d;
      }
      else {
        if (bVar1 != 2) {
          if (bVar1 == 5) {
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"EXTERNAL [",10)
            ;
            if ((((CordRepBtree *)this)->super_CordRep).tag != '\x05') {
              __assert_fail("IsExternal()",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                            ,0x385,"CordRepExternal *absl::cord_internal::CordRep::external()");
            }
            src._M_str = pcVar6;
            src._M_len = (size_t)((CordRepBtree *)this)->edges_[0];
            CEscape_abi_cxx11_((string *)local_220,
                               (lts_20250127 *)(((CordRepBtree *)this)->super_CordRep).length,src);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(char *)local_220._0_8_,
                       CONCAT71(local_220._9_7_,local_220[8]));
          }
          else {
            if (bVar1 < 6) {
              bVar2 = true;
              label._M_str = (char *)0x1;
              label._M_len = (size_t)"";
              cord_internal::CordRepBtree::Dump
                        ((CordRepBtree *)this,(CordRep *)0x0,label,SUB81((ostream *)local_1a8,0),
                         in_R9);
              goto LAB_004ac6bb;
            }
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"FLAT cap=",9);
            bVar1 = (((CordRepBtree *)this)->super_CordRep).tag;
            if ((bVar1 - 0xf9 < 7) || (bVar1 < 6)) {
LAB_004ac70e:
              __assert_fail("tag >= FLAT && tag <= MAX_FLAT_TAG",
                            "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_flat.h"
                            ,0xb6,"CordRepFlat *absl::cord_internal::CordRep::flat()");
            }
            poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar4," [",2);
            bVar1 = (((CordRepBtree *)this)->super_CordRep).tag;
            src_00._M_str._0_4_ = bVar1 - 0xf9;
            if (((uint)src_00._M_str < 7) || (bVar1 < 6)) goto LAB_004ac70e;
            src_00._M_len = (size_t)(((CordRepBtree *)this)->super_CordRep).storage;
            src_00._M_str._4_4_ = 0;
            CEscape_abi_cxx11_((string *)local_220,
                               (lts_20250127 *)(((CordRepBtree *)this)->super_CordRep).length,src_00
                              );
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_1a8,(char *)local_220._0_8_,
                       CONCAT71(local_220._9_7_,local_220[8]));
          }
          if ((Data *)local_220._0_8_ != (Data *)(local_220 + 0x10)) {
            operator_delete((void *)local_220._0_8_,
                            (ulong)((long)&(local_210.allocated.allocated_data)->data_ + 1));
          }
          bVar2 = true;
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"]\n",2);
          goto LAB_004ac6bb;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"CRC crc=",8);
        if ((((CordRepBtree *)this)->super_CordRep).tag != '\x02') {
LAB_004ac74c:
          __assert_fail("IsCrc()",
                        "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_rep_crc.h"
                        ,0x5a,"CordRepCrc *absl::cord_internal::CordRep::crc()");
        }
        local_1c8._0_4_ =
             crc_internal::CrcCordState::Checksum
                       ((CrcCordState *)(((CordRepBtree *)this)->edges_ + 1));
        local_1b8.ptr = "%08x";
        local_1b0 = 4;
        local_1c8._4_4_ = 0;
        local_1c0 = str_format_internal::FormatArgImpl::Dispatch<unsigned_int>;
        local_220._0_8_ = &local_1b8;
        InlinedVector<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
        ::InlinedVector<const_absl::lts_20250127::str_format_internal::FormatArgImpl_*,_0>
                  ((InlinedVector<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
                    *)(local_220 + 8),(FormatArgImpl *)&local_1c8,(FormatArgImpl *)&local_1b8,
                   &local_221);
        poVar4 = str_format_internal::Streamable::Print
                           ((Streamable *)local_220,(ostream *)local_1a8);
        if ((local_220[8] & 1) != 0) {
          operator_delete(local_210.allocated.allocated_data,
                          local_210.allocated.allocated_capacity << 4);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        lVar5 = 0x10;
        if ((((CordRepBtree *)this)->super_CordRep).tag != '\x02') goto LAB_004ac74c;
      }
      iVar7 = iVar7 + 1;
      this = *(lts_20250127 **)((((CordRepBtree *)this)->super_CordRep).storage + lVar5 + -0xd);
      bVar2 = false;
    }
LAB_004ac6bb:
    psVar3 = local_1d0;
    if (bVar2) {
      std::__cxx11::stringbuf::str();
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
      std::ios_base::~ios_base(local_138);
      return psVar3;
    }
  } while( true );
}

Assistant:

static std::string ReportError(absl::Nonnull<CordRep*> root,
                               absl::Nonnull<CordRep*> node) {
  std::ostringstream buf;
  buf << "Error at node " << node << " in:";
  DumpNode(root, true, &buf);
  return buf.str();
}